

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwaLookups.cpp
# Opt level: O1

void generateNoop(void)

{
  int i;
  uint uVar1;
  ulong uVar2;
  
  puts("const unsigned short dwaCompressorNoOp[] = ");
  putchar(0x7b);
  uVar2 = 0;
  do {
    if ((uVar2 & 7) == 0) {
      printf("\n    ");
    }
    printf("0x%04x, ",uVar2);
    uVar1 = (int)uVar2 + 1;
    uVar2 = (ulong)uVar1;
  } while (uVar1 != 0x10000);
  puts("\n};");
  return;
}

Assistant:

void
generateNoop()
{
    printf("const unsigned short dwaCompressorNoOp[] = \n");
    printf("{");
    for (int i=0; i<65536; ++i) {

        if (i % 8 == 0) {
            printf("\n    ");
        }

        unsigned short dst;
        char *tmp = (char *)(&dst);

        unsigned short src = (unsigned short)i;
        Xdr::write <CharPtrIO> (tmp,  src);

        printf("0x%04x, ", dst);
    }
    printf("\n};\n");
}